

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  int local_554;
  allocator local_541;
  string local_540;
  allocator local_519;
  string local_518;
  allocator local_4f1;
  string local_4f0;
  allocator local_4c9;
  string local_4c8;
  allocator local_4a1;
  string local_4a0;
  allocator local_479;
  string local_478;
  allocator local_451;
  string local_450;
  allocator local_429;
  string local_428;
  allocator local_401;
  string local_400;
  allocator local_3d9;
  string local_3d8;
  allocator local_3b1;
  string local_3b0;
  allocator local_389;
  string local_388;
  allocator local_361;
  string local_360;
  allocator local_339;
  string local_338;
  allocator local_311;
  string local_310;
  allocator local_2e9;
  string local_2e8;
  allocator local_2c1;
  string local_2c0;
  allocator local_299;
  string local_298;
  allocator local_271;
  string local_270;
  allocator local_249;
  string local_248;
  allocator local_221;
  string local_220;
  allocator local_1f9;
  string local_1f8;
  allocator local_1d1;
  string local_1d0;
  allocator local_1a9;
  string local_1a8;
  allocator local_181;
  string local_180;
  allocator local_159;
  string local_158;
  allocator local_131;
  string local_130;
  allocator local_109;
  string local_108;
  allocator local_e1;
  string local_e0;
  allocator local_b9;
  string local_b8;
  int local_94;
  undefined1 local_90 [4];
  int num_iterations;
  u32string u32str;
  undefined1 local_60 [8];
  u16string u16str;
  undefined1 local_38 [8];
  string u8str;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  u8str.field_2._8_8_ = argv;
  if (argc < 2) {
    std::operator<<((ostream *)&std::cout,"Usage: benchmark UTF8FILE [ITERATIONS]\n");
    argv_local._4_4_ = 1;
  }
  else {
    u16str.field_2._8_8_ = argv;
    main::$_0::operator()[abi_cxx11_((string *)local_38,(void *)((long)&u16str.field_2 + 8));
    anon_unknown.dwarf_d849::cpputf8_u8_to_u16((u16string *)local_60,(string *)local_38);
    anon_unknown.dwarf_d849::cpputf8_u8_to_u32((u32string *)local_90,(string *)local_38);
    if (argc < 3) {
      local_554 = 1;
    }
    else {
      local_554 = atoi(*(char **)(u8str.field_2._8_8_ + 0x10));
    }
    local_94 = local_554;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_b8,"codecvt u8 to u16",&local_b9);
    (anonymous_namespace)::
    time_function_call<std::__cxx11::u16string(*)(std::__cxx11::string_const&),std::__cxx11::string>
              (anon_unknown.dwarf_d849::codecvt_u8_to_u16,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
               local_554,&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
    std::allocator<char>::~allocator((allocator<char> *)&local_b9);
    iVar1 = local_94;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_e0,"cpputf8 u8 to u16",&local_e1);
    (anonymous_namespace)::
    time_function_call<std::__cxx11::u16string(*)(std::__cxx11::string_const&),std::__cxx11::string>
              (anon_unknown.dwarf_d849::cpputf8_u8_to_u16,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,iVar1,
               &local_e0);
    std::__cxx11::string::~string((string *)&local_e0);
    std::allocator<char>::~allocator((allocator<char> *)&local_e1);
    iVar1 = local_94;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_108,"boost u8 to u16",&local_109);
    (anonymous_namespace)::
    time_function_call<std::__cxx11::u16string(*)(std::__cxx11::string_const&),std::__cxx11::string>
              (anon_unknown.dwarf_d849::boost_u8_to_u16,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,iVar1,
               &local_108);
    std::__cxx11::string::~string((string *)&local_108);
    std::allocator<char>::~allocator((allocator<char> *)&local_109);
    iVar1 = local_94;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_130,"range u8 to u16",&local_131);
    (anonymous_namespace)::
    time_function_call<std::__cxx11::u16string(*)(std::__cxx11::string_const&),std::__cxx11::string>
              (anon_unknown.dwarf_d849::range_u8_to_u16,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,iVar1,
               &local_130);
    std::__cxx11::string::~string((string *)&local_130);
    std::allocator<char>::~allocator((allocator<char> *)&local_131);
    iVar1 = local_94;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_158,"range view u8 to u16",&local_159);
    (anonymous_namespace)::
    time_function_call<std::__cxx11::u16string(*)(std::__cxx11::string_const&),std::__cxx11::string>
              (anon_unknown.dwarf_d849::range_view_u8_to_u16,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,iVar1,
               &local_158);
    std::__cxx11::string::~string((string *)&local_158);
    std::allocator<char>::~allocator((allocator<char> *)&local_159);
    std::operator<<((ostream *)&std::cout,"\n");
    iVar1 = local_94;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_180,"codecvt u8 to u32",&local_181);
    (anonymous_namespace)::
    time_function_call<std::__cxx11::u32string(*)(std::__cxx11::string_const&),std::__cxx11::string>
              (anon_unknown.dwarf_d849::codecvt_u8_to_u32,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,iVar1,
               &local_180);
    std::__cxx11::string::~string((string *)&local_180);
    std::allocator<char>::~allocator((allocator<char> *)&local_181);
    iVar1 = local_94;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1a8,"cpputf8 u8 to u32",&local_1a9);
    (anonymous_namespace)::
    time_function_call<std::__cxx11::u32string(*)(std::__cxx11::string_const&),std::__cxx11::string>
              (anon_unknown.dwarf_d849::cpputf8_u8_to_u32,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,iVar1,
               &local_1a8);
    std::__cxx11::string::~string((string *)&local_1a8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1a9);
    iVar1 = local_94;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1d0,"boost u8 to u32",&local_1d1);
    (anonymous_namespace)::
    time_function_call<std::__cxx11::u32string(*)(std::__cxx11::string_const&),std::__cxx11::string>
              (anon_unknown.dwarf_d849::boost_u8_to_u32,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,iVar1,
               &local_1d0);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
    iVar1 = local_94;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1f8,"range u8 to u32",&local_1f9);
    (anonymous_namespace)::
    time_function_call<std::__cxx11::u32string(*)(std::__cxx11::string_const&),std::__cxx11::string>
              (anon_unknown.dwarf_d849::range_u8_to_u32,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,iVar1,
               &local_1f8);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
    iVar1 = local_94;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_220,"range view u8 to u32",&local_221);
    (anonymous_namespace)::
    time_function_call<std::__cxx11::u32string(*)(std::__cxx11::string_const&),std::__cxx11::string>
              (anon_unknown.dwarf_d849::range_view_u8_to_u32,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,iVar1,
               &local_220);
    std::__cxx11::string::~string((string *)&local_220);
    std::allocator<char>::~allocator((allocator<char> *)&local_221);
    std::operator<<((ostream *)&std::cout,"\n");
    iVar1 = local_94;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_248,"codecvt u16 to u8",&local_249);
    (anonymous_namespace)::
    time_function_call<std::__cxx11::string(*)(std::__cxx11::u16string_const&),std::__cxx11::u16string>
              (anon_unknown.dwarf_d849::codecvt_u16_to_u8,
               (basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> *)
               local_60,iVar1,&local_248);
    std::__cxx11::string::~string((string *)&local_248);
    std::allocator<char>::~allocator((allocator<char> *)&local_249);
    iVar1 = local_94;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_270,"cpputf8 u16 to u8",&local_271);
    (anonymous_namespace)::
    time_function_call<std::__cxx11::string(*)(std::__cxx11::u16string_const&),std::__cxx11::u16string>
              (anon_unknown.dwarf_d849::cpputf8_u16_to_u8,
               (basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> *)
               local_60,iVar1,&local_270);
    std::__cxx11::string::~string((string *)&local_270);
    std::allocator<char>::~allocator((allocator<char> *)&local_271);
    iVar1 = local_94;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_298,"boost u16 to u8",&local_299);
    (anonymous_namespace)::
    time_function_call<std::__cxx11::string(*)(std::__cxx11::u16string_const&),std::__cxx11::u16string>
              (anon_unknown.dwarf_d849::boost_u16_to_u8,
               (basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> *)
               local_60,iVar1,&local_298);
    std::__cxx11::string::~string((string *)&local_298);
    std::allocator<char>::~allocator((allocator<char> *)&local_299);
    iVar1 = local_94;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_2c0,"range u16 to u8",&local_2c1);
    (anonymous_namespace)::
    time_function_call<std::__cxx11::string(*)(std::__cxx11::u16string_const&),std::__cxx11::u16string>
              (anon_unknown.dwarf_d849::range_u16_to_u8,
               (basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> *)
               local_60,iVar1,&local_2c0);
    std::__cxx11::string::~string((string *)&local_2c0);
    std::allocator<char>::~allocator((allocator<char> *)&local_2c1);
    iVar1 = local_94;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_2e8,"range view u16 to u8",&local_2e9);
    (anonymous_namespace)::
    time_function_call<std::__cxx11::string(*)(std::__cxx11::u16string_const&),std::__cxx11::u16string>
              (anon_unknown.dwarf_d849::range_view_u16_to_u8,
               (basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> *)
               local_60,iVar1,&local_2e8);
    std::__cxx11::string::~string((string *)&local_2e8);
    std::allocator<char>::~allocator((allocator<char> *)&local_2e9);
    std::operator<<((ostream *)&std::cout,"\n");
    iVar1 = local_94;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_310,"*codecvt u16 to u32",&local_311);
    (anonymous_namespace)::
    time_function_call<std::__cxx11::u32string(*)(std::__cxx11::u16string_const&),std::__cxx11::u16string>
              (anon_unknown.dwarf_d849::codecvt_u16_to_u32,
               (basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> *)
               local_60,iVar1,&local_310);
    std::__cxx11::string::~string((string *)&local_310);
    std::allocator<char>::~allocator((allocator<char> *)&local_311);
    iVar1 = local_94;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_338,"*cpputf8 u16 to u32",&local_339);
    (anonymous_namespace)::
    time_function_call<std::__cxx11::u32string(*)(std::__cxx11::u16string_const&),std::__cxx11::u16string>
              (anon_unknown.dwarf_d849::cpputf8_u16_to_u32,
               (basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> *)
               local_60,iVar1,&local_338);
    std::__cxx11::string::~string((string *)&local_338);
    std::allocator<char>::~allocator((allocator<char> *)&local_339);
    iVar1 = local_94;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_360,"boost u16 to u32",&local_361);
    (anonymous_namespace)::
    time_function_call<std::__cxx11::u32string(*)(std::__cxx11::u16string_const&),std::__cxx11::u16string>
              (anon_unknown.dwarf_d849::boost_u16_to_u32,
               (basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> *)
               local_60,iVar1,&local_360);
    std::__cxx11::string::~string((string *)&local_360);
    std::allocator<char>::~allocator((allocator<char> *)&local_361);
    iVar1 = local_94;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_388,"range u16 to u32",&local_389);
    (anonymous_namespace)::
    time_function_call<std::__cxx11::u32string(*)(std::__cxx11::u16string_const&),std::__cxx11::u16string>
              (anon_unknown.dwarf_d849::range_u16_to_u32,
               (basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> *)
               local_60,iVar1,&local_388);
    std::__cxx11::string::~string((string *)&local_388);
    std::allocator<char>::~allocator((allocator<char> *)&local_389);
    iVar1 = local_94;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_3b0,"range view u16 to u32",&local_3b1);
    (anonymous_namespace)::
    time_function_call<std::__cxx11::u32string(*)(std::__cxx11::u16string_const&),std::__cxx11::u16string>
              (anon_unknown.dwarf_d849::range_view_u16_to_u32,
               (basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> *)
               local_60,iVar1,&local_3b0);
    std::__cxx11::string::~string((string *)&local_3b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_3b1);
    std::operator<<((ostream *)&std::cout,"\n");
    iVar1 = local_94;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_3d8,"codecvt u32 to u8",&local_3d9);
    (anonymous_namespace)::
    time_function_call<std::__cxx11::string(*)(std::__cxx11::u32string_const&),std::__cxx11::u32string>
              (anon_unknown.dwarf_d849::codecvt_u32_to_u8,
               (basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
               local_90,iVar1,&local_3d8);
    std::__cxx11::string::~string((string *)&local_3d8);
    std::allocator<char>::~allocator((allocator<char> *)&local_3d9);
    iVar1 = local_94;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_400,"cpputf8 u32 to u8",&local_401);
    (anonymous_namespace)::
    time_function_call<std::__cxx11::string(*)(std::__cxx11::u32string_const&),std::__cxx11::u32string>
              (anon_unknown.dwarf_d849::cpputf8_u32_to_u8,
               (basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
               local_90,iVar1,&local_400);
    std::__cxx11::string::~string((string *)&local_400);
    std::allocator<char>::~allocator((allocator<char> *)&local_401);
    iVar1 = local_94;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_428,"boost u32 to u8",&local_429);
    (anonymous_namespace)::
    time_function_call<std::__cxx11::string(*)(std::__cxx11::u32string_const&),std::__cxx11::u32string>
              (anon_unknown.dwarf_d849::boost_u32_to_u8,
               (basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
               local_90,iVar1,&local_428);
    std::__cxx11::string::~string((string *)&local_428);
    std::allocator<char>::~allocator((allocator<char> *)&local_429);
    iVar1 = local_94;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_450,"range u32 to u8",&local_451);
    (anonymous_namespace)::
    time_function_call<std::__cxx11::string(*)(std::__cxx11::u32string_const&),std::__cxx11::u32string>
              (anon_unknown.dwarf_d849::range_u32_to_u8,
               (basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
               local_90,iVar1,&local_450);
    std::__cxx11::string::~string((string *)&local_450);
    std::allocator<char>::~allocator((allocator<char> *)&local_451);
    iVar1 = local_94;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_478,"range view u32 to u8",&local_479);
    (anonymous_namespace)::
    time_function_call<std::__cxx11::string(*)(std::__cxx11::u32string_const&),std::__cxx11::u32string>
              (anon_unknown.dwarf_d849::range_view_u32_to_u8,
               (basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
               local_90,iVar1,&local_478);
    std::__cxx11::string::~string((string *)&local_478);
    std::allocator<char>::~allocator((allocator<char> *)&local_479);
    std::operator<<((ostream *)&std::cout,"\n");
    iVar1 = local_94;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_4a0,"*codecvt u32 to u16",&local_4a1);
    (anonymous_namespace)::
    time_function_call<std::__cxx11::u16string(*)(std::__cxx11::u32string_const&),std::__cxx11::u32string>
              (anon_unknown.dwarf_d849::codecvt_u32_to_u16,
               (basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
               local_90,iVar1,&local_4a0);
    std::__cxx11::string::~string((string *)&local_4a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_4a1);
    iVar1 = local_94;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_4c8,"*cpputf8 u32 to u16",&local_4c9);
    (anonymous_namespace)::
    time_function_call<std::__cxx11::u16string(*)(std::__cxx11::u32string_const&),std::__cxx11::u32string>
              (anon_unknown.dwarf_d849::cpputf8_u32_to_u16,
               (basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
               local_90,iVar1,&local_4c8);
    std::__cxx11::string::~string((string *)&local_4c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_4c9);
    iVar1 = local_94;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_4f0,"boost u32 to u16",&local_4f1);
    (anonymous_namespace)::
    time_function_call<std::__cxx11::u16string(*)(std::__cxx11::u32string_const&),std::__cxx11::u32string>
              (anon_unknown.dwarf_d849::boost_u32_to_u16,
               (basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
               local_90,iVar1,&local_4f0);
    std::__cxx11::string::~string((string *)&local_4f0);
    std::allocator<char>::~allocator((allocator<char> *)&local_4f1);
    iVar1 = local_94;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_518,"range u32 to u16",&local_519);
    (anonymous_namespace)::
    time_function_call<std::__cxx11::u16string(*)(std::__cxx11::u32string_const&),std::__cxx11::u32string>
              (anon_unknown.dwarf_d849::range_u32_to_u16,
               (basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
               local_90,iVar1,&local_518);
    std::__cxx11::string::~string((string *)&local_518);
    std::allocator<char>::~allocator((allocator<char> *)&local_519);
    iVar1 = local_94;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_540,"range view u32 to u16",&local_541);
    (anonymous_namespace)::
    time_function_call<std::__cxx11::u16string(*)(std::__cxx11::u32string_const&),std::__cxx11::u32string>
              (anon_unknown.dwarf_d849::range_view_u32_to_u16,
               (basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
               local_90,iVar1,&local_540);
    std::__cxx11::string::~string((string *)&local_540);
    std::allocator<char>::~allocator((allocator<char> *)&local_541);
    std::__cxx11::u32string::~u32string((u32string *)local_90);
    std::__cxx11::u16string::~u16string((u16string *)local_60);
    std::__cxx11::string::~string((string *)local_38);
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char** argv)
{
    if (argc < 2) {
        std::cout << "Usage: benchmark UTF8FILE [ITERATIONS]\n";
        return 1;
    }

    const string u8str = [argv] {
        std::ifstream f(argv[1]);
        return string(std::istreambuf_iterator<char>{f},
                      std::istreambuf_iterator<char>{});
    }();

    const u16string u16str = cpputf8_u8_to_u16(u8str);
    const u32string u32str = cpputf8_u8_to_u32(u8str);

    const int num_iterations = argc > 2 ? std::atoi(argv[2]) : 1;


    // UTF-8 to UTF-16
    time_function_call(codecvt_u8_to_u16, u8str, num_iterations, "codecvt u8 to u16");
    time_function_call(cpputf8_u8_to_u16, u8str, num_iterations, "cpputf8 u8 to u16");
    time_function_call(boost_u8_to_u16, u8str, num_iterations, "boost u8 to u16");
    time_function_call(range_u8_to_u16, u8str, num_iterations, "range u8 to u16");
    time_function_call(range_view_u8_to_u16, u8str, num_iterations, "range view u8 to u16");
    std::cout << "\n";

    // UTF-8 to UTF-32
    time_function_call(codecvt_u8_to_u32, u8str, num_iterations, "codecvt u8 to u32");
    time_function_call(cpputf8_u8_to_u32, u8str, num_iterations, "cpputf8 u8 to u32");
    time_function_call(boost_u8_to_u32, u8str, num_iterations, "boost u8 to u32");
    time_function_call(range_u8_to_u32, u8str, num_iterations, "range u8 to u32");
    time_function_call(range_view_u8_to_u32, u8str, num_iterations, "range view u8 to u32");
    std::cout << "\n";

    // UTF-16 to UTF-8
    time_function_call(codecvt_u16_to_u8, u16str, num_iterations, "codecvt u16 to u8");
    time_function_call(cpputf8_u16_to_u8, u16str, num_iterations, "cpputf8 u16 to u8");
    time_function_call(boost_u16_to_u8, u16str, num_iterations, "boost u16 to u8");
    time_function_call(range_u16_to_u8, u16str, num_iterations, "range u16 to u8");
    time_function_call(range_view_u16_to_u8, u16str, num_iterations, "range view u16 to u8");
    std::cout << "\n";

    // UTF-16 to UTF-32
    time_function_call(codecvt_u16_to_u32, u16str, num_iterations, "*codecvt u16 to u32");
    time_function_call(cpputf8_u16_to_u32, u16str, num_iterations, "*cpputf8 u16 to u32");
    time_function_call(boost_u16_to_u32, u16str, num_iterations, "boost u16 to u32");
    time_function_call(range_u16_to_u32, u16str, num_iterations, "range u16 to u32");
    time_function_call(range_view_u16_to_u32, u16str, num_iterations, "range view u16 to u32");
    std::cout << "\n";

    // UTF-32 to UTF-8
    time_function_call(codecvt_u32_to_u8, u32str, num_iterations, "codecvt u32 to u8");
    time_function_call(cpputf8_u32_to_u8, u32str, num_iterations, "cpputf8 u32 to u8");
    time_function_call(boost_u32_to_u8, u32str, num_iterations, "boost u32 to u8");
    time_function_call(range_u32_to_u8, u32str, num_iterations, "range u32 to u8");
    time_function_call(range_view_u32_to_u8, u32str, num_iterations, "range view u32 to u8");
    std::cout << "\n";

    // UTF-32 to UTF-16
    time_function_call(codecvt_u32_to_u16, u32str, num_iterations, "*codecvt u32 to u16");
    time_function_call(cpputf8_u32_to_u16, u32str, num_iterations, "*cpputf8 u32 to u16");
    time_function_call(boost_u32_to_u16, u32str, num_iterations, "boost u32 to u16");
    time_function_call(range_u32_to_u16, u32str, num_iterations, "range u32 to u16");
    time_function_call(range_view_u32_to_u16, u32str, num_iterations, "range view u32 to u16");
}